

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

Matrix<double,_3,_2> * tcu::operator*(Matrix<double,_3,_1> *a,Matrix<double,_1,_2> *b)

{
  double dVar1;
  double dVar2;
  int row;
  long lVar3;
  Matrix<double,_3,_2> *res;
  Matrix<double,_3,_2> *in_RDI;
  double dVar4;
  
  (in_RDI->m_data).m_data[1].m_data[1] = 0.0;
  (in_RDI->m_data).m_data[1].m_data[2] = 0.0;
  (in_RDI->m_data).m_data[0].m_data[2] = 0.0;
  (in_RDI->m_data).m_data[1].m_data[0] = 0.0;
  (in_RDI->m_data).m_data[0].m_data[0] = 0.0;
  (in_RDI->m_data).m_data[0].m_data[1] = 0.0;
  lVar3 = 0;
  do {
    dVar4 = 1.0;
    if (lVar3 != 0) {
      dVar4 = 0.0;
    }
    (in_RDI->m_data).m_data[0].m_data[lVar3] = dVar4;
    dVar4 = 1.0;
    if (lVar3 != 1) {
      dVar4 = 0.0;
    }
    (in_RDI->m_data).m_data[1].m_data[lVar3] = dVar4;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  dVar4 = (b->m_data).m_data[0].m_data[0];
  dVar1 = (b->m_data).m_data[1].m_data[0];
  lVar3 = 0;
  do {
    dVar2 = (a->m_data).m_data[0].m_data[lVar3];
    (in_RDI->m_data).m_data[0].m_data[lVar3] = dVar2 * dVar4 + 0.0;
    (in_RDI->m_data).m_data[1].m_data[lVar3] = dVar2 * dVar1 + 0.0;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  return in_RDI;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}